

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceCurveSweptAreaSolid::IfcSurfaceCurveSweptAreaSolid
          (IfcSurfaceCurveSweptAreaSolid *this)

{
  IfcSurfaceCurveSweptAreaSolid *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x80,"IfcSurfaceCurveSweptAreaSolid");
  IfcSweptAreaSolid::IfcSweptAreaSolid
            (&this->super_IfcSweptAreaSolid,&PTR_construction_vtable_24__010bf1f0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceCurveSweptAreaSolid,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceCurveSweptAreaSolid,_4UL> *)
             &(this->super_IfcSweptAreaSolid).field_0x50,&PTR_construction_vtable_24__010bf2a0);
  (this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x10bf110;
  *(undefined8 *)&this->field_0x80 = 0x10bf1d8;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x10bf138;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x10bf160;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x30 = 0x10bf188;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x50 = 0x10bf1b0;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcSweptAreaSolid).field_0x60,
             (LazyObject *)0x0);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSurface>::Lazy(&this->ReferenceSurface,(LazyObject *)0x0);
  return;
}

Assistant:

IfcSurfaceCurveSweptAreaSolid() : Object("IfcSurfaceCurveSweptAreaSolid") {}